

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

uint32_t union_vector16(uint16_t *array1,uint32_t length1,uint16_t *array2,uint32_t length2,
                       uint16_t *output)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ushort uVar4;
  uint uVar5;
  size_t sVar6;
  undefined4 in_register_0000000c;
  uint16_t *set_2;
  undefined1 (*buffer_00) [16];
  uint uVar7;
  ushort uVar8;
  undefined4 in_register_00000034;
  uint16_t uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint16_t buffer [16];
  undefined8 local_70;
  undefined1 local_68 [2] [16];
  undefined8 local_40;
  undefined8 local_38;
  
  local_40 = CONCAT44(in_register_00000034,length1);
  local_38 = CONCAT44(in_register_0000000c,length2);
  if (length1 < 8 || length2 < 8) {
    sVar6 = union_uint16(array1,(ulong)length1,array2,(ulong)length2,output);
    return (uint32_t)sVar6;
  }
  auVar1 = vlddqu_avx(*(undefined1 (*) [16])array1);
  auVar14 = vlddqu_avx(*(undefined1 (*) [16])array2);
  auVar2 = vpminuw_avx(auVar1,auVar14);
  auVar14 = vpmaxuw_avx(auVar1,auVar14);
  auVar1 = vpalignr_avx(auVar2,auVar2,2);
  auVar2 = vpminuw_avx(auVar1,auVar14);
  auVar14 = vpmaxuw_avx(auVar1,auVar14);
  auVar1 = vpalignr_avx(auVar2,auVar2,2);
  auVar2 = vpminuw_avx(auVar1,auVar14);
  auVar14 = vpmaxuw_avx(auVar1,auVar14);
  auVar1 = vpalignr_avx(auVar2,auVar2,2);
  auVar2 = vpminuw_avx(auVar1,auVar14);
  auVar14 = vpmaxuw_avx(auVar1,auVar14);
  auVar1 = vpalignr_avx(auVar2,auVar2,2);
  auVar2 = vpminuw_avx(auVar1,auVar14);
  auVar14 = vpmaxuw_avx(auVar1,auVar14);
  auVar1 = vpalignr_avx(auVar2,auVar2,2);
  auVar2 = vpminuw_avx(auVar1,auVar14);
  auVar14 = vpmaxuw_avx(auVar1,auVar14);
  auVar1 = vpalignr_avx(auVar2,auVar2,2);
  auVar13 = vpminuw_avx(auVar1,auVar14);
  auVar2 = vpmaxuw_avx(auVar1,auVar14);
  auVar1 = vpalignr_avx(auVar13,auVar13,2);
  auVar14 = vpminuw_avx(auVar1,auVar2);
  auVar13 = vpmaxuw_avx(auVar1,auVar2);
  auVar14 = vpalignr_avx(auVar14,auVar14,2);
  auVar1 = vpcmpeqd_avx(auVar2,auVar2);
  auVar1 = vpalignr_avx(auVar14,auVar1,0xe);
  auVar1 = vpcmpeqw_avx(auVar1,auVar14);
  auVar1 = vpacksswb_avx(auVar1,(undefined1  [16])0x0);
  uVar8 = (ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 | (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3
          | (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 | (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6
          | (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 | (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9
          | (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar1[0xf] >> 7) << 0xf;
  auVar1 = vlddqu_avx(*(undefined1 (*) [16])(uniqshuf + (ulong)uVar8 * 0x10));
  auVar1 = vpshufb_avx(auVar14,auVar1);
  *(undefined1 (*) [16])output = auVar1;
  buffer_00 = (undefined1 (*) [16])(output + (8 - (ulong)(uint)POPCOUNT((uint)uVar8)));
  uVar5 = 1;
  if (0xf < length2 && 0xf < length1) {
    uVar8 = array1[8];
    uVar9 = array2[8];
    uVar10 = 1;
    uVar12 = 1;
    auVar1 = auVar14;
    do {
      uVar5 = (uint)uVar10;
      uVar11 = (uint)uVar12;
      if (uVar9 < uVar8) {
        auVar14 = vlddqu_avx(*(undefined1 (*) [16])(array2 + uVar12 * 8));
        uVar11 = uVar11 + 1;
        uVar12 = (ulong)uVar11;
        if (length2 >> 3 <= uVar11) goto LAB_00102889;
        uVar9 = array2[uVar11 * 8];
      }
      else {
        auVar14 = vlddqu_avx(*(undefined1 (*) [16])(array1 + uVar10 * 8));
        uVar5 = uVar5 + 1;
        uVar10 = (ulong)uVar5;
        if (length1 >> 3 <= uVar5) goto LAB_00102889;
        uVar8 = array1[uVar5 * 8];
      }
      auVar3 = vpminuw_avx(auVar14,auVar13);
      auVar2 = vpmaxuw_avx(auVar14,auVar13);
      auVar14 = vpalignr_avx(auVar3,auVar3,2);
      auVar13 = vpminuw_avx(auVar14,auVar2);
      auVar2 = vpmaxuw_avx(auVar14,auVar2);
      auVar14 = vpalignr_avx(auVar13,auVar13,2);
      auVar13 = vpminuw_avx(auVar14,auVar2);
      auVar2 = vpmaxuw_avx(auVar14,auVar2);
      auVar14 = vpalignr_avx(auVar13,auVar13,2);
      auVar13 = vpminuw_avx(auVar14,auVar2);
      auVar2 = vpmaxuw_avx(auVar14,auVar2);
      auVar14 = vpalignr_avx(auVar13,auVar13,2);
      auVar13 = vpminuw_avx(auVar14,auVar2);
      auVar2 = vpmaxuw_avx(auVar14,auVar2);
      auVar14 = vpalignr_avx(auVar13,auVar13,2);
      auVar13 = vpminuw_avx(auVar14,auVar2);
      auVar2 = vpmaxuw_avx(auVar14,auVar2);
      auVar14 = vpalignr_avx(auVar13,auVar13,2);
      auVar13 = vpminuw_avx(auVar14,auVar2);
      auVar2 = vpmaxuw_avx(auVar14,auVar2);
      auVar14 = vpalignr_avx(auVar13,auVar13,2);
      auVar3 = vpminuw_avx(auVar14,auVar2);
      auVar13 = vpmaxuw_avx(auVar14,auVar2);
      auVar14 = vpalignr_avx(auVar3,auVar3,2);
      auVar1 = vpalignr_avx(auVar14,auVar1,0xe);
      auVar1 = vpcmpeqw_avx(auVar1,auVar14);
      auVar1 = vpacksswb_avx(auVar1,(undefined1  [16])0x0);
      uVar4 = (ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar1[0xf] >> 7) << 0xf;
      auVar1 = vlddqu_avx(*(undefined1 (*) [16])(uniqshuf + (ulong)uVar4 * 0x10));
      auVar1 = vpshufb_avx(auVar14,auVar1);
      *buffer_00 = auVar1;
      buffer_00 = (undefined1 (*) [16])
                  ((long)buffer_00 + (8 - (ulong)(uint)POPCOUNT((uint)uVar4)) * 2);
      auVar1 = auVar14;
    } while( true );
  }
  uVar11 = 8;
LAB_00102948:
  local_70 = (ulong)((long)buffer_00 - (long)output) >> 1;
  auVar1 = vpalignr_avx(auVar13,auVar14,0xe);
  auVar1 = vpcmpeqw_avx(auVar13,auVar1);
  auVar1 = vpacksswb_avx(auVar1,(undefined1  [16])0x0);
  uVar8 = (ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 | (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3
          | (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 | (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6
          | (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 | (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9
          | (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar1[0xf] >> 7) << 0xf;
  uVar7 = 8 - POPCOUNT((uint)uVar8);
  auVar1 = vlddqu_avx(*(undefined1 (*) [16])(uniqshuf + (ulong)uVar8 * 0x10));
  local_68[0] = vpshufb_avx(auVar13,auVar1);
  if (uVar5 == length1 >> 3) {
    memcpy(local_68[0] + (ulong)uVar7 * 2,array1 + (length1 & 0xfffffff8),(ulong)((length1 & 7) * 2)
          );
    uVar7 = uVar7 + (length1 & 7);
    qsort(local_68,(ulong)uVar7,2,uint16_compare);
    sVar6 = 1;
    if (1 < uVar7) {
      uVar5 = 1;
      uVar10 = 1;
      do {
        if (*(short *)(local_68[0] + uVar10 * 2) != *(short *)(local_68[-1] + uVar10 * 2 + 0xe)) {
          uVar12 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
          *(short *)(local_68[0] + uVar12 * 2) = *(short *)(local_68[0] + uVar10 * 2);
        }
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
      sVar6 = (size_t)uVar5;
    }
    set_2 = array2 + uVar11;
    uVar11 = (int)local_38 - uVar11;
  }
  else {
    memcpy(local_68[0] + (ulong)uVar7 * 2,array2 + uVar11,(ulong)((length2 & 7) * 2));
    uVar7 = uVar7 + (length2 & 7);
    qsort(local_68,(ulong)uVar7,2,uint16_compare);
    sVar6 = 1;
    if (1 < uVar7) {
      uVar11 = 1;
      uVar10 = 1;
      do {
        if (*(short *)(local_68[0] + uVar10 * 2) != *(short *)(local_68[-1] + uVar10 * 2 + 0xe)) {
          uVar12 = (ulong)uVar11;
          uVar11 = uVar11 + 1;
          *(short *)(local_68[0] + uVar12 * 2) = *(short *)(local_68[0] + uVar10 * 2);
        }
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
      sVar6 = (size_t)uVar11;
    }
    set_2 = array1 + uVar5 * 8;
    uVar11 = (int)local_40 + uVar5 * -8;
  }
  sVar6 = union_uint16((uint16_t *)local_68,sVar6,set_2,(ulong)uVar11,(uint16_t *)buffer_00);
  return (int)sVar6 + (int)local_70;
LAB_00102889:
  auVar3 = vpminuw_avx(auVar14,auVar13);
  auVar2 = vpmaxuw_avx(auVar14,auVar13);
  auVar14 = vpalignr_avx(auVar3,auVar3,2);
  auVar13 = vpminuw_avx(auVar14,auVar2);
  auVar2 = vpmaxuw_avx(auVar14,auVar2);
  auVar14 = vpalignr_avx(auVar13,auVar13,2);
  auVar13 = vpminuw_avx(auVar14,auVar2);
  auVar2 = vpmaxuw_avx(auVar14,auVar2);
  auVar14 = vpalignr_avx(auVar13,auVar13,2);
  auVar13 = vpminuw_avx(auVar14,auVar2);
  auVar2 = vpmaxuw_avx(auVar14,auVar2);
  auVar14 = vpalignr_avx(auVar13,auVar13,2);
  auVar13 = vpminuw_avx(auVar14,auVar2);
  auVar2 = vpmaxuw_avx(auVar14,auVar2);
  auVar14 = vpalignr_avx(auVar13,auVar13,2);
  auVar13 = vpminuw_avx(auVar14,auVar2);
  auVar2 = vpmaxuw_avx(auVar14,auVar2);
  auVar14 = vpalignr_avx(auVar13,auVar13,2);
  auVar13 = vpminuw_avx(auVar14,auVar2);
  auVar2 = vpmaxuw_avx(auVar14,auVar2);
  auVar14 = vpalignr_avx(auVar13,auVar13,2);
  auVar3 = vpminuw_avx(auVar14,auVar2);
  auVar13 = vpmaxuw_avx(auVar14,auVar2);
  auVar14 = vpalignr_avx(auVar3,auVar3,2);
  auVar1 = vpalignr_avx(auVar14,auVar1,0xe);
  auVar1 = vpcmpeqw_avx(auVar1,auVar14);
  auVar1 = vpacksswb_avx(auVar1,(undefined1  [16])0x0);
  uVar8 = (ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 | (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3
          | (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 | (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6
          | (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 | (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9
          | (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar1[0xf] >> 7) << 0xf;
  auVar1 = vlddqu_avx(*(undefined1 (*) [16])(uniqshuf + (ulong)uVar8 * 0x10));
  auVar1 = vpshufb_avx(auVar14,auVar1);
  *buffer_00 = auVar1;
  buffer_00 = (undefined1 (*) [16])((long)buffer_00 + (8 - (ulong)(uint)POPCOUNT((uint)uVar8)) * 2);
  uVar11 = uVar11 << 3;
  goto LAB_00102948;
}

Assistant:

CROARING_TARGET_AVX2
// a one-pass SSE union algorithm
// This function may not be safe if array1 == output or array2 == output.
uint32_t union_vector16(const uint16_t *__restrict__ array1, uint32_t length1,
                        const uint16_t *__restrict__ array2, uint32_t length2,
                        uint16_t *__restrict__ output) {
    if ((length1 < 8) || (length2 < 8)) {
        return (uint32_t)union_uint16(array1, length1, array2, length2, output);
    }
    __m128i vA, vB, V, vecMin, vecMax;
    __m128i laststore;
    uint16_t *initoutput = output;
    uint32_t len1 = length1 / 8;
    uint32_t len2 = length2 / 8;
    uint32_t pos1 = 0;
    uint32_t pos2 = 0;
    // we start the machine
    vA = _mm_lddqu_si128((const __m128i *)array1 + pos1);
    pos1++;
    vB = _mm_lddqu_si128((const __m128i *)array2 + pos2);
    pos2++;
    sse_merge(&vA, &vB, &vecMin, &vecMax);
    laststore = _mm_set1_epi16(-1);
    output += store_unique(laststore, vecMin, output);
    laststore = vecMin;
    if ((pos1 < len1) && (pos2 < len2)) {
        uint16_t curA, curB;
        curA = array1[8 * pos1];
        curB = array2[8 * pos2];
        while (true) {
            if (curA <= curB) {
                V = _mm_lddqu_si128((const __m128i *)array1 + pos1);
                pos1++;
                if (pos1 < len1) {
                    curA = array1[8 * pos1];
                } else {
                    break;
                }
            } else {
                V = _mm_lddqu_si128((const __m128i *)array2 + pos2);
                pos2++;
                if (pos2 < len2) {
                    curB = array2[8 * pos2];
                } else {
                    break;
                }
            }
            sse_merge(&V, &vecMax, &vecMin, &vecMax);
            output += store_unique(laststore, vecMin, output);
            laststore = vecMin;
        }
        sse_merge(&V, &vecMax, &vecMin, &vecMax);
        output += store_unique(laststore, vecMin, output);
        laststore = vecMin;
    }
    // we finish the rest off using a scalar algorithm
    // could be improved?
    //
    // copy the small end on a tmp buffer
    uint32_t len = (uint32_t)(output - initoutput);
    uint16_t buffer[16];
    uint32_t leftoversize = store_unique(laststore, vecMax, buffer);
    if (pos1 == len1) {
        memcpy(buffer + leftoversize, array1 + 8 * pos1,
               (length1 - 8 * len1) * sizeof(uint16_t));
        leftoversize += length1 - 8 * len1;
        qsort(buffer, leftoversize, sizeof(uint16_t), uint16_compare);

        leftoversize = unique(buffer, leftoversize);
        len += (uint32_t)union_uint16(buffer, leftoversize, array2 + 8 * pos2,
                                      length2 - 8 * pos2, output);
    } else {
        memcpy(buffer + leftoversize, array2 + 8 * pos2,
               (length2 - 8 * len2) * sizeof(uint16_t));
        leftoversize += length2 - 8 * len2;
        qsort(buffer, leftoversize, sizeof(uint16_t), uint16_compare);
        leftoversize = unique(buffer, leftoversize);
        len += (uint32_t)union_uint16(buffer, leftoversize, array1 + 8 * pos1,
                                      length1 - 8 * pos1, output);
    }
    return len;
}